

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O2

int pk_parse_key_pkcs1_der(mbedtls_rsa_context *rsa,uchar *key,size_t keylen)

{
  int iVar1;
  size_t sVar2;
  uchar *end;
  uchar *p;
  size_t len;
  
  p = key;
  iVar1 = mbedtls_asn1_get_tag(&p,key + keylen,&len,0x30);
  if (iVar1 == 0) {
    end = p + len;
    iVar1 = mbedtls_asn1_get_int(&p,end,&rsa->ver);
    if (iVar1 == 0) {
      if (rsa->ver != 0) {
        return -0x3d80;
      }
      iVar1 = mbedtls_asn1_get_mpi(&p,end,&rsa->N);
      if (((((iVar1 == 0) && (iVar1 = mbedtls_asn1_get_mpi(&p,end,&rsa->E), iVar1 == 0)) &&
           (iVar1 = mbedtls_asn1_get_mpi(&p,end,&rsa->D), iVar1 == 0)) &&
          ((iVar1 = mbedtls_asn1_get_mpi(&p,end,&rsa->P), iVar1 == 0 &&
           (iVar1 = mbedtls_asn1_get_mpi(&p,end,&rsa->Q), iVar1 == 0)))) &&
         ((iVar1 = mbedtls_asn1_get_mpi(&p,end,&rsa->DP), iVar1 == 0 &&
          ((iVar1 = mbedtls_asn1_get_mpi(&p,end,&rsa->DQ), iVar1 == 0 &&
           (iVar1 = mbedtls_asn1_get_mpi(&p,end,&rsa->QP), iVar1 == 0)))))) {
        sVar2 = mbedtls_mpi_size(&rsa->N);
        rsa->len = sVar2;
        if (p != end) {
          mbedtls_rsa_free(rsa);
          return -0x3d66;
        }
        iVar1 = mbedtls_rsa_check_privkey(rsa);
        if (iVar1 != 0) {
          mbedtls_rsa_free(rsa);
          return iVar1;
        }
        return 0;
      }
      mbedtls_rsa_free(rsa);
    }
  }
  return iVar1 + -0x3d00;
}

Assistant:

static int pk_parse_key_pkcs1_der( mbedtls_rsa_context *rsa,
                                   const unsigned char *key,
                                   size_t keylen )
{
    int ret;
    size_t len;
    unsigned char *p, *end;

    p = (unsigned char *) key;
    end = p + keylen;

    /*
     * This function parses the RSAPrivateKey (PKCS#1)
     *
     *  RSAPrivateKey ::= SEQUENCE {
     *      version           Version,
     *      modulus           INTEGER,  -- n
     *      publicExponent    INTEGER,  -- e
     *      privateExponent   INTEGER,  -- d
     *      prime1            INTEGER,  -- p
     *      prime2            INTEGER,  -- q
     *      exponent1         INTEGER,  -- d mod (p-1)
     *      exponent2         INTEGER,  -- d mod (q-1)
     *      coefficient       INTEGER,  -- (inverse of q) mod p
     *      otherPrimeInfos   OtherPrimeInfos OPTIONAL
     *  }
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    end = p + len;

    if( ( ret = mbedtls_asn1_get_int( &p, end, &rsa->ver ) ) != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    if( rsa->ver != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_VERSION );
    }

    if( ( ret = mbedtls_asn1_get_mpi( &p, end, &rsa->N  ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &rsa->E  ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &rsa->D  ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &rsa->P  ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &rsa->Q  ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &rsa->DP ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &rsa->DQ ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &rsa->QP ) ) != 0 )
    {
        mbedtls_rsa_free( rsa );
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    rsa->len = mbedtls_mpi_size( &rsa->N );

    if( p != end )
    {
        mbedtls_rsa_free( rsa );
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }

    if( ( ret = mbedtls_rsa_check_privkey( rsa ) ) != 0 )
    {
        mbedtls_rsa_free( rsa );
        return( ret );
    }

    return( 0 );
}